

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number.cpp
# Opt level: O1

Variable __thiscall
LiteScript::_Type_NUMBER::OSubstractAndAssign(_Type_NUMBER *this,Variable *obj1,Variable *obj2)

{
  Number *pNVar1;
  bool bVar2;
  Object *pOVar3;
  Type *pTVar4;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar5;
  Variable VVar6;
  Variable tmp;
  undefined1 auStack_58 [32];
  Variable local_38;
  
  pOVar3 = Variable::operator->((Variable *)in_RCX);
  pTVar4 = Object::GetType(pOVar3);
  bVar2 = Type::operator!=(pTVar4,(Type *)obj1);
  if (bVar2) {
    Variable::Convert((Variable *)(auStack_58 + 0x10),in_RCX);
    pOVar3 = Variable::operator->((Variable *)(auStack_58 + 0x10));
    pTVar4 = Object::GetType(pOVar3);
    bVar2 = Type::operator!=(pTVar4,(Type *)obj1);
    if (bVar2) {
      pOVar3 = Variable::operator->(obj2);
      Memory::Create((Memory *)auStack_58,(Type *)pOVar3->memory);
      Variable::operator=(&local_38,obj2);
      Variable::~Variable(&local_38);
      Variable::~Variable((Variable *)auStack_58);
    }
    else {
      pOVar3 = Variable::operator->((Variable *)(auStack_58 + 0x10));
      pNVar1 = (Number *)pOVar3->data;
      pOVar3 = Variable::operator->(obj2);
      Number::operator-=((Number *)pOVar3->data,pNVar1);
    }
    Variable::Variable((Variable *)this,obj2);
    Variable::~Variable((Variable *)(auStack_58 + 0x10));
    puVar5 = extraout_RDX_00;
  }
  else {
    pOVar3 = Variable::operator->((Variable *)in_RCX);
    pNVar1 = (Number *)pOVar3->data;
    pOVar3 = Variable::operator->(obj2);
    Number::operator-=((Number *)pOVar3->data,pNVar1);
    Variable::Variable((Variable *)this,obj2);
    puVar5 = extraout_RDX;
  }
  VVar6.nb_ref = puVar5;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::_Type_NUMBER::OSubstractAndAssign(LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    if (obj2->GetType() != *this) {
        Variable tmp = obj2.Convert(*this);
        if (tmp->GetType() != *this) {
            obj1 = obj1->memory.Create(Type::NIL);
            return obj1;
        }
        obj1->GetData<Number>() -= tmp->GetData<Number>();
        return obj1;
    }
    obj1->GetData<Number>() -= obj2->GetData<Number>();
    return obj1;
}